

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

int __thiscall
google::protobuf::Reflection::GetRepeatedEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  int iVar1;
  RepeatedField<int> *pRVar2;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnumValue","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedEnumValue",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_28,&local_30);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 8) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedEnumValue",CPPTYPE_ENUM);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    iVar1 = internal::ExtensionSet::GetRepeatedEnum
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),index
                      );
  }
  else {
    pRVar2 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
    iVar1 = *(int *)((long)pRVar2->arena_or_elements_ + (long)index * 4);
  }
  return iVar1;
}

Assistant:

int Reflection::GetRepeatedEnumValue(const Message& message,
                                     const FieldDescriptor* field,
                                     int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnumValue, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  return value;
}